

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Dfs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *pGVar6;
  char *pcVar7;
  char *pcVar8;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar3 = false;
  bVar2 = false;
  while (iVar4 = Extra_UtilGetopt(argc,argv,"nrvh"), iVar4 != -1) {
    uVar5 = iVar4 - 0x68U >> 1 | (uint)((iVar4 - 0x68U & 1) != 0) << 0x1f;
    if (uVar5 == 7) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else if (uVar5 == 5) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else {
      if (uVar5 != 3) {
        iVar4 = -2;
        Abc_Print(-2,"usage: &dfs [-nrvh]\n");
        Abc_Print(-2,"\t        orders objects in the DFS order\n");
        pcVar8 = "yes";
        pcVar7 = "yes";
        if (!bVar1) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-n    : toggle using normalized ordering [default = %s]\n",pcVar7);
        pcVar7 = "yes";
        if (!bVar3) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-r    : toggle using reverse DFS ordering [default = %s]\n",pcVar7);
        if (!bVar2) {
          pcVar8 = "no";
        }
        Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar8);
        pcVar7 = "\t-h    : print the command usage\n";
        goto LAB_00248028;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  pGVar6 = pAbc->pGia;
  if (pGVar6 == (Gia_Man_t *)0x0) {
    pcVar7 = "Abc_CommandAbc9Dfs(): There is no AIG.\n";
    iVar4 = -1;
LAB_00248028:
    Abc_Print(iVar4,pcVar7);
    return 1;
  }
  if (bVar1) {
    pGVar6 = Gia_ManDupOrderAiger(pGVar6);
    if (!bVar2) goto LAB_0024806f;
    pcVar7 = "AIG objects are reordered as follows: CIs, ANDs, COs.\n";
  }
  else if (bVar3) {
    pGVar6 = Gia_ManDupOrderDfsReverse(pGVar6);
    if (!bVar2) goto LAB_0024806f;
    pcVar7 = "AIG objects are reordered in the reserve DFS order.\n";
  }
  else {
    pGVar6 = Gia_ManDupOrderDfs(pGVar6);
    if (!bVar2) goto LAB_0024806f;
    pcVar7 = "AIG objects are reordered in the DFS order.\n";
  }
  Abc_Print(-1,pcVar7);
LAB_0024806f:
  Abc_FrameUpdateGia(pAbc,pGVar6);
  return 0;
}

Assistant:

int Abc_CommandAbc9Dfs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    int fNormal  = 0;
    int fReverse = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fNormal ^= 1;
            break;
        case 'r':
            fReverse ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dfs(): There is no AIG.\n" );
        return 1;
    }
    if ( fNormal )
    {
        pTemp = Gia_ManDupOrderAiger( pAbc->pGia );
        if ( fVerbose )
            Abc_Print( -1, "AIG objects are reordered as follows: CIs, ANDs, COs.\n" );
    }
    else if ( fReverse )
    {
        pTemp = Gia_ManDupOrderDfsReverse( pAbc->pGia );
        if ( fVerbose )
            Abc_Print( -1, "AIG objects are reordered in the reserve DFS order.\n" );
    }
    else
    {
        pTemp = Gia_ManDupOrderDfs( pAbc->pGia );
        if ( fVerbose )
            Abc_Print( -1, "AIG objects are reordered in the DFS order.\n" );
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &dfs [-nrvh]\n" );
    Abc_Print( -2, "\t        orders objects in the DFS order\n" );
    Abc_Print( -2, "\t-n    : toggle using normalized ordering [default = %s]\n", fNormal? "yes": "no" );
    Abc_Print( -2, "\t-r    : toggle using reverse DFS ordering [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}